

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O3

string * __thiscall
wasm::wasm2cMangle_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Name name,Signature sig)

{
  uint *puVar1;
  wasm wVar2;
  int iVar3;
  size_t sVar4;
  uintptr_t *puVar5;
  Type type;
  char cVar6;
  Type type_00;
  wasm *pwVar7;
  undefined1 local_208 [8];
  stringstream ss;
  long local_1f8 [3];
  uint auStack_1e0 [22];
  ios_base local_188 [264];
  Type local_80;
  Signature sig_local;
  long *local_50;
  anon_class_1_0_00000001 wasm2cSignature;
  long local_40 [2];
  
  type_00 = sig.params.id;
  type.id = name.super_IString.str._M_str;
  sig_local.results.id = name.super_IString.str._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_80.id = type.id;
  sig_local.params.id = type_00.id;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Z_","",type.id,type_00.id,sig.results.id.id);
  cVar6 = (char)__return_storage_ptr__;
  if (this != (wasm *)0x0) {
    pwVar7 = (wasm *)0x0;
    do {
      wVar2 = pwVar7[sig_local.results.id];
      iVar3 = isalnum((uint)(byte)wVar2);
      if ((wVar2 == (wasm)0x5f) || ((byte)wVar2 != 0x5a && iVar3 != 0)) {
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        std::__cxx11::string::push_back(cVar6);
        std::__cxx11::stringstream::stringstream((stringstream *)local_208);
        *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
             *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
        puVar1 = (uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
        std::ios_base::~ios_base(local_188);
      }
      pwVar7 = pwVar7 + 1;
    } while (this != pwVar7);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  wasm2cMangle::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_50,type_00);
  std::__cxx11::string::push_back(cVar6);
  if (((undefined1  [16])name.super_IString.str & (undefined1  [16])0x1) == (undefined1  [16])0x0 ||
      type.id < 7) {
    wasm2cMangle::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_50,type);
    std::__cxx11::string::push_back(cVar6);
  }
  else {
    _ss = 0;
    local_208 = (undefined1  [8])&local_80;
    sVar4 = Type::size(&local_80);
    if (sVar4 != 0) {
      do {
        do {
          puVar5 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_208);
          wasm2cMangle::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&local_50,(Type)*puVar5);
          std::__cxx11::string::push_back(cVar6);
          _ss = _ss + 1;
        } while (_ss != sVar4);
      } while (local_208 != (undefined1  [8])&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string wasm2cMangle(Name name, Signature sig) {
  const char escapePrefix = 'Z';
  std::string mangled = "Z_";
  for (unsigned char c : name.str) {
    if ((isalnum(c) && c != escapePrefix) || c == '_') {
      // This character is ok to emit as it is.
      mangled += c;
    } else {
      // This must be escaped, as prefix + hex character code.
      mangled += escapePrefix;
      std::stringstream ss;
      ss << std::hex << std::uppercase << unsigned(c);
      mangled += ss.str();
    }
  }

  // Emit the result and params.
  mangled += "Z_";

  auto wasm2cSignature = [](Type type) {
    TODO_SINGLE_COMPOUND(type);
    switch (type.getBasic()) {
      case Type::none:
        return 'v';
      case Type::i32:
        return 'i';
      case Type::i64:
        return 'j';
      case Type::f32:
        return 'f';
      case Type::f64:
        return 'd';
      default:
        Fatal() << "unhandled wasm2c wrapper signature type: " << type;
    }
  };

  mangled += wasm2cSignature(sig.results);
  if (sig.params.isTuple()) {
    for (const auto& param : sig.params) {
      mangled += wasm2cSignature(param);
    }
  } else {
    mangled += wasm2cSignature(sig.params);
  }

  return mangled;
}